

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O0

ParamGenerator<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>_>
 __thiscall testing::internal::ValueArray::operator_cast_to_ParamGenerator(ValueArray *this)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  undefined8 in_RSI;
  ParamGenerator<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>_>
  PVar1;
  vector<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
  local_30;
  ValueArray<std::tuple<const_char_*,_const_char_*>,_std::tuple<const_char_*,_const_char_*>,_std::tuple<const_char_*,_const_char_*>,_std::tuple<const_char_*,_const_char_*>,_std::tuple<const_char_*,_const_char_*>,_std::tuple<const_char_*,_const_char_*>,_std::tuple<const_char_*,_const_char_*>,_std::tuple<const_char_*,_const_char_*>,_std::tuple<const_char_*,_const_char_*>,_std::tuple<const_char_*,_const_char_*>,_std::tuple<const_char_*,_const_char_*>,_std::tuple<const_char_*,_const_char_*>_>
  *this_local;
  
  this_local = (ValueArray<std::tuple<const_char_*,_const_char_*>,_std::tuple<const_char_*,_const_char_*>,_std::tuple<const_char_*,_const_char_*>,_std::tuple<const_char_*,_const_char_*>,_std::tuple<const_char_*,_const_char_*>,_std::tuple<const_char_*,_const_char_*>,_std::tuple<const_char_*,_const_char_*>,_std::tuple<const_char_*,_const_char_*>,_std::tuple<const_char_*,_const_char_*>,_std::tuple<const_char_*,_const_char_*>,_std::tuple<const_char_*,_const_char_*>,_std::tuple<const_char_*,_const_char_*>_>
                *)this;
  ValueArray<std::tuple<char_const*,char_const*>,std::tuple<char_const*,char_const*>,std::tuple<char_const*,char_const*>,std::tuple<char_const*,char_const*>,std::tuple<char_const*,char_const*>,std::tuple<char_const*,char_const*>,std::tuple<char_const*,char_const*>,std::tuple<char_const*,char_const*>,std::tuple<char_const*,char_const*>,std::tuple<char_const*,char_const*>,std::tuple<char_const*,char_const*>,std::tuple<char_const*,char_const*>>
  ::
  MakeVector<std::tuple<std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>>,0ul,1ul,2ul,3ul,4ul,5ul,6ul,7ul,8ul,9ul,10ul,11ul>
            (&local_30,in_RSI);
  ValuesIn<std::vector<std::tuple<std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::tuple<std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>>>>>
            ((testing *)this,&local_30);
  std::
  vector<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
  ::~vector(&local_30);
  PVar1.impl_.
  super___shared_ptr<const_testing::internal::ParamGeneratorInterface<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = extraout_RDX._M_pi;
  PVar1.impl_.
  super___shared_ptr<const_testing::internal::ParamGeneratorInterface<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)this;
  return (ParamGenerator<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>_>
          )PVar1.impl_.
           super___shared_ptr<const_testing::internal::ParamGeneratorInterface<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ;
}

Assistant:

operator ParamGenerator<T>() const {  // NOLINT
    return ValuesIn(MakeVector<T>(std::make_index_sequence<sizeof...(Ts)>()));
  }